

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O2

void __thiscall Json_TwoKeywords_Test::Json_TwoKeywords_Test(Json_TwoKeywords_Test *this)

{
  anon_unknown.dwarf_b7c4f::Json::Json(&this->super_Json);
  (this->super_Json).super_Test._vptr_Test = (_func_int **)&PTR__Test_001aac28;
  return;
}

Assistant:

TEST_F (Json, TwoKeywords) {
    json::parser<json_out_callbacks> p;
    p.input (" true false "s);
    std::string const res = p.eof ();
    EXPECT_EQ (res, "");
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::unexpected_extra_input));
    EXPECT_EQ (p.coordinate (), (json::coord{7U, 1U}));
}